

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawSimpleTest.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::Draw::anon_unknown_9::SimpleDrawInstanced::iterate
          (TestStatus *__return_storage_ptr__,SimpleDrawInstanced *this)

{
  VkPrimitiveTopology VVar1;
  Context *this_00;
  TestLog *pTVar2;
  DeviceInterface *pDVar3;
  Image *this_01;
  undefined1 auVar4 [16];
  SimpleDrawInstanced *pSVar5;
  TestStatus *pTVar6;
  bool bVar7;
  VkResult VVar8;
  VkQueue pVVar9;
  Allocator *allocator;
  char *__s;
  int iVar10;
  int y;
  int x;
  int x_00;
  int iVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 extraout_XMM0 [16];
  double dVar15;
  undefined8 uVar16;
  allocator<char> local_169;
  SimpleDrawInstanced *local_168;
  undefined8 local_160;
  undefined4 local_158;
  TestStatus *local_150;
  TestLog *local_148;
  VkQueue local_140;
  double local_138;
  double local_130;
  ConstPixelBufferAccess renderedFrame;
  string local_f8 [32];
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  Texture2D referenceFrame;
  VkSubmitInfo submitInfo;
  
  this_00 = (this->super_SimpleDraw).super_DrawTestsBaseClass.super_TestInstance.m_context;
  pTVar2 = this_00->m_testCtx->m_log;
  local_150 = __return_storage_ptr__;
  pVVar9 = Context::getUniversalQueue(this_00);
  DrawTestsBaseClass::beginRenderPass((DrawTestsBaseClass *)this);
  vertexBuffer.m_internal =
       (((this->super_SimpleDraw).super_DrawTestsBaseClass.m_vertexBuffer.m_ptr)->m_object).
       super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  pDVar3 = (this->super_SimpleDraw).super_DrawTestsBaseClass.m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x58])
            (pDVar3,(this->super_SimpleDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1);
  pDVar3 = (this->super_SimpleDraw).super_DrawTestsBaseClass.m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x4c])
            (pDVar3,(this->super_SimpleDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->super_SimpleDraw).super_DrawTestsBaseClass.m_pipeline.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  VVar1 = (this->super_SimpleDraw).super_DrawTestsBaseClass.m_topology;
  local_168 = this;
  if (VVar1 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
    uVar16 = 6;
  }
  else {
    if (VVar1 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) goto LAB_0068fe01;
    uVar16 = 4;
  }
  pDVar3 = (this->super_SimpleDraw).super_DrawTestsBaseClass.m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x59])
            (pDVar3,(this->super_SimpleDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,uVar16,4,2,2);
LAB_0068fe01:
  pSVar5 = local_168;
  pDVar3 = (local_168->super_SimpleDraw).super_DrawTestsBaseClass.m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x76])
            (pDVar3,(local_168->super_SimpleDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar3 = (pSVar5->super_SimpleDraw).super_DrawTestsBaseClass.m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x4a])
            (pDVar3,(pSVar5->super_SimpleDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar3 = (pSVar5->super_SimpleDraw).super_DrawTestsBaseClass.m_vk;
  VVar8 = (*pDVar3->_vptr_DeviceInterface[2])(pDVar3,pVVar9,1);
  ::vk::checkResult(VVar8,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawSimpleTest.cpp"
                    ,0x10c);
  pDVar3 = (pSVar5->super_SimpleDraw).super_DrawTestsBaseClass.m_vk;
  VVar8 = (*pDVar3->_vptr_DeviceInterface[3])(pDVar3,pVVar9);
  ::vk::checkResult(VVar8,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawSimpleTest.cpp"
                    ,0x10e);
  pDVar3 = (pSVar5->super_SimpleDraw).super_DrawTestsBaseClass.m_vk;
  VVar8 = (*pDVar3->_vptr_DeviceInterface[3])(pDVar3,pVVar9);
  ::vk::checkResult(VVar8,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawSimpleTest.cpp"
                    ,0x111);
  renderedFrame.m_format =
       ::vk::mapVkFormat((pSVar5->super_SimpleDraw).super_DrawTestsBaseClass.m_colorAttachmentFormat
                        );
  tcu::Texture2D::Texture2D(&referenceFrame,&renderedFrame.m_format,0x100,0x100);
  tcu::Texture2D::allocLevel(&referenceFrame,0);
  renderedFrame.m_format.order = R;
  renderedFrame.m_format.type = SNORM_INT8;
  renderedFrame.m_size.m_data[0] = 0;
  renderedFrame.m_size.m_data[1] = 0x3f800000;
  local_148 = pTVar2;
  local_140 = pVVar9;
  tcu::clear(referenceFrame.super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame);
  auVar14 = ZEXT816(0x3fe0000000000000);
  y = 0;
  iVar10 = referenceFrame.m_width;
  if (referenceFrame.m_width < 1) {
    iVar10 = 0;
  }
  local_138 = (double)referenceFrame.m_height * 0.5;
  iVar11 = referenceFrame.m_height;
  if (referenceFrame.m_height < 1) {
    iVar11 = 0;
  }
  dVar15 = (double)referenceFrame.m_width * 0.5;
  local_130 = dVar15;
  for (; y != iVar11; y = y + 1) {
    fVar12 = (float)((double)y / local_138) + -1.0;
    auVar13._8_8_ = -(ulong)(0.0 < auVar14._8_8_);
    auVar13._0_8_ = -(ulong)(0.3 < fVar12);
    auVar4._8_8_ = -(ulong)(auVar14._8_8_ < 0.0);
    auVar4._0_8_ = -(ulong)(fVar12 < -0.6);
    auVar14 = auVar13 | auVar4;
    for (x_00 = 0; iVar10 != x_00; x_00 = x_00 + 1) {
      if (((auVar13 | auVar4) & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        auVar14._0_8_ = (double)((float)((double)x_00 / dVar15) + -1.0);
        if ((-0.3 <= auVar14._0_8_) && (auVar14._0_8_ <= 0.6)) {
          renderedFrame.m_format.order = R;
          renderedFrame.m_format.type = SNORM_INT8;
          renderedFrame.m_size.m_data._0_8_ = &DAT_3f8000003f800000;
          tcu::PixelBufferAccess::setPixel
                    (referenceFrame.super_TextureLevelPyramid.m_access.
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                     ._M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame,x_00,y,0);
          auVar14 = extraout_XMM0;
          dVar15 = local_130;
        }
      }
    }
  }
  this_01 = (local_168->super_SimpleDraw).super_DrawTestsBaseClass.m_colorTargetImage.m_ptr;
  allocator = Context::getDefaultAllocator
                        ((local_168->super_SimpleDraw).super_DrawTestsBaseClass.super_TestInstance.
                         m_context);
  local_158 = 0;
  local_160 = 0;
  Image::readSurface(&renderedFrame,this_01,local_140,allocator,VK_IMAGE_LAYOUT_GENERAL,
                     (VkOffset3D)(ZEXT412(0) << 0x40),0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  bVar7 = tcu::fuzzyCompare(local_148,"Result","Image comparison result",
                            &(referenceFrame.super_TextureLevelPyramid.m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                             super_ConstPixelBufferAccess,&renderedFrame,0.05,COMPARE_LOG_RESULT);
  __s = qpGetTestResultName((uint)!bVar7);
  std::__cxx11::string::string<std::allocator<char>>(local_f8,__s,&local_169);
  pTVar6 = local_150;
  local_150->m_code = (uint)!bVar7;
  std::__cxx11::string::string((string *)&local_150->m_description,local_f8);
  std::__cxx11::string::~string(local_f8);
  tcu::Texture3D::~Texture3D((Texture3D *)&referenceFrame);
  return pTVar6;
}

Assistant:

tcu::TestStatus SimpleDrawInstanced::iterate (void)
{
	tcu::TestLog &log		= m_context.getTestContext().getLog();

	const vk::VkQueue queue = m_context.getUniversalQueue();

	beginRenderPass();

	const vk::VkDeviceSize vertexBufferOffset = 0;
	const vk::VkBuffer vertexBuffer = m_vertexBuffer->object();

	m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

	m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

	switch (m_topology)
	{
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
			m_vk.cmdDraw(*m_cmdBuffer, 6, 4, 2, 2);
			break;
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			m_vk.cmdDraw(*m_cmdBuffer, 4, 4, 2, 2);
			break;
		case vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_PATCH_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LAST:
			DE_FATAL("Topology not implemented");
			break;
		default:
			DE_FATAL("Unknown topology");
			break;
	}

	m_vk.cmdEndRenderPass(*m_cmdBuffer);
	m_vk.endCommandBuffer(*m_cmdBuffer);

	vk::VkSubmitInfo submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,							// const void*				pNext;
		0,										// deUint32					waitSemaphoreCount;
		DE_NULL,								// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,										// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
		0,										// deUint32					signalSemaphoreCount;
		DE_NULL								// const VkSemaphore*		pSignalSemaphores;
	};
	VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));

	VK_CHECK(m_vk.queueWaitIdle(queue));

	// Validation
	VK_CHECK(m_vk.queueWaitIdle(queue));

	tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));

	referenceFrame.allocLevel(0);

	const deInt32 frameWidth	= referenceFrame.getWidth();
	const deInt32 frameHeight	= referenceFrame.getHeight();

	tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	ReferenceImageInstancedCoordinates refInstancedCoords;

	for (int y = 0; y < frameHeight; y++)
	{
		const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

		for (int x = 0; x < frameWidth; x++)
		{
			const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

			if ((yCoord >= refInstancedCoords.bottom	&&
				 yCoord <= refInstancedCoords.top		&&
				 xCoord >= refInstancedCoords.left		&&
				 xCoord <= refInstancedCoords.right))
				referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f), x, y);
		}
	}

	const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
		vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

	qpTestResult res = QP_TEST_RESULT_PASS;

	if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
		referenceFrame.getLevel(0), renderedFrame, 0.05f,
		tcu::COMPARE_LOG_RESULT)) {
		res = QP_TEST_RESULT_FAIL;
	}

	return tcu::TestStatus(res, qpGetTestResultName(res));
}